

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O3

any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
* __thiscall
asio::execution::detail::any_executor_base::
prefer_fn<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>,asio::io_context::basic_executor_type<std::allocator<void>,0u>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>>
          (any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
           *__return_storage_ptr__,any_executor_base *this,void *ex,void *prop)

{
  uint uVar1;
  anon_struct_8_0_00000001_for___align aVar2;
  
  aVar2 = (this->object_).__align;
  uVar1 = *(uint *)((long)&this->object_ + 0xc);
  (__return_storage_ptr__->super_any_executor_base).target_fns_ =
       (target_fns *)
       target_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>(bool,std::enable_if<!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value,void>::type*)
       ::fns_with_execute;
  (__return_storage_ptr__->super_any_executor_base).object_fns_ =
       (object_fns *)
       object_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>(std::enable_if<(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value)&&(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,std::shared_ptr<void>>::value),void>::type*)
       ::fns;
  (__return_storage_ptr__->super_any_executor_base).object_.__align = aVar2;
  *(uint *)((long)&(__return_storage_ptr__->super_any_executor_base).object_ + 0xc) =
       uVar1 & 0xfffffffe;
  (__return_storage_ptr__->super_any_executor_base).target_ = __return_storage_ptr__;
  __return_storage_ptr__->prop_fns_ =
       (prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
          ::prop_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>()::fns;
  return __return_storage_ptr__;
}

Assistant:

static Poly prefer_fn(const void* ex, const void* prop)
  {
    return prefer_fn_impl<Poly, Ex, Prop>(ex, prop, 0);
  }